

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O3

int ptls_handshake(ptls_t *tls,ptls_buffer_t *sendbuf,void *input,size_t *inlen,
                  ptls_handshake_properties_t *properties)

{
  undefined1 *puVar1;
  void *pvVar2;
  byte bVar3;
  ushort uVar4;
  anon_enum_32 aVar5;
  ptls_context_t *ppVar6;
  ptls_hash_algorithm_t *algo;
  size_t sVar7;
  ptls_key_exchange_algorithm_t *ppVar8;
  st_ptls_hash_context_t *psVar9;
  int iVar10;
  uint uVar11;
  st_ptls_key_schedule_t *psVar12;
  size_t sVar13;
  size_t sVar14;
  uint uVar15;
  size_t sVar16;
  long lVar17;
  size_t sVar18;
  long lVar19;
  ptls_cipher_suite_t *ppVar20;
  ulong uVar21;
  ptls_cipher_suite_t **pppVar22;
  size_t sVar23;
  long lVar24;
  size_t sVar25;
  uint8_t *puVar26;
  ushort *puVar27;
  ulong uVar28;
  ushort *puVar29;
  ptls_key_exchange_algorithm_t **pppVar30;
  uint8_t *puVar31;
  ptls_cipher_suite_t *cs;
  ptls_iovec_t salt;
  ptls_iovec_t ikm;
  uint32_t _v;
  size_t consumed;
  uint32_t max_early_data_size;
  uint32_t age_add;
  ptls_iovec_t resumption_ticket;
  uint32_t lifetime;
  uint8_t decryptbuf_small [256];
  uint local_1d0;
  ushort *local_1a8;
  uint local_1a0;
  uint32_t local_19c;
  size_t local_198;
  ptls_buffer_t local_190;
  size_t local_170;
  size_t local_168;
  size_t local_160;
  size_t local_158;
  size_t local_150;
  ulong local_148;
  uint32_t local_13c;
  ptls_iovec_t local_138 [16];
  
  aVar5 = tls->state;
  if (PTLS_STATE_SERVER_EXPECT_FINISHED < aVar5) {
    __assert_fail("tls->state < PTLS_STATE_POST_HANDSHAKE_MIN",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/mattcaswell[P]picotls/t/../lib/picotls.c"
                  ,0x8e5,
                  "int ptls_handshake(ptls_t *, ptls_buffer_t *, const void *, size_t *, ptls_handshake_properties_t *)"
                 );
  }
  sVar25 = sendbuf->off;
  if (aVar5 == PTLS_STATE_CLIENT_SEND_EARLY_DATA) {
    iVar10 = send_alert(tls,sendbuf,'\x01','\x01');
    if (iVar10 != 0) {
      return iVar10;
    }
    tls->state = PTLS_STATE_CLIENT_EXPECT_SERVER_HELLO;
  }
  else if (aVar5 == PTLS_STATE_CLIENT_HANDSHAKE_START) {
    if ((input != (void *)0x0) && (*inlen != 0)) {
      __assert_fail("input == NULL || *inlen == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/mattcaswell[P]picotls/t/../lib/picotls.c"
                    ,0x8ea,
                    "int ptls_handshake(ptls_t *, ptls_buffer_t *, const void *, size_t *, ptls_handshake_properties_t *)"
                   );
    }
    ppVar6 = tls->ctx;
    algo = (*ppVar6->cipher_suites)->hash;
    if (properties == (ptls_handshake_properties_t *)0x0) {
      local_1d0 = 0;
      cs = (ptls_cipher_suite_t *)0x0;
      sVar25 = 0;
      puVar27 = (ushort *)0x0;
    }
    else {
      puVar27 = (ushort *)(properties->client).session_ticket.base;
      if (puVar27 == (ushort *)0x0) {
        local_1d0 = 0;
        cs = (ptls_cipher_suite_t *)0x0;
LAB_0010defe:
        sVar25 = 0;
        puVar27 = (ushort *)0x0;
      }
      else {
        puVar31 = (uint8_t *)((properties->client).session_ticket.len + (long)puVar27);
        local_1a8 = puVar27;
        iVar10 = decode64(&local_148,(uint8_t **)&local_1a8,puVar31);
        if (((iVar10 == 0) && (1 < (long)puVar31 - (long)local_1a8)) &&
           (2 < (ulong)((long)puVar31 - (long)(local_1a8 + 1)))) {
          uVar4 = *local_1a8;
          lVar17 = 0;
          uVar28 = 0;
          do {
            uVar28 = (ulong)*(byte *)((long)(local_1a8 + 1) + lVar17) | uVar28 << 8;
            lVar17 = lVar17 + 1;
          } while (lVar17 != 3);
          puVar26 = (uint8_t *)((long)local_1a8 + 5);
          if ((ulong)((long)puVar31 - (long)puVar26) < uVar28) goto LAB_0010dd22;
          puVar29 = (ushort *)(puVar26 + uVar28);
          iVar10 = decode_new_session_ticket
                             (&local_13c,&local_19c,(ptls_iovec_t *)&local_190,&local_1a0,puVar26,
                              (uint8_t *)puVar29);
          ppVar20 = (ptls_cipher_suite_t *)0x0;
          if ((1 < (ulong)((long)puVar31 - (long)puVar29)) && (iVar10 == 0)) {
            sVar25 = (size_t)(ushort)(*puVar29 << 8 | *puVar29 >> 8);
            puVar27 = puVar29 + 1;
            if ((uint8_t *)(sVar25 + 2 + (long)puVar29) == puVar31 &&
                sVar25 <= (ulong)((long)puVar31 - (long)puVar27)) {
              pppVar22 = ppVar6->cipher_suites;
              cs = *pppVar22;
              if (cs != (ptls_cipher_suite_t *)0x0) {
                ppVar20 = (ptls_cipher_suite_t *)0x0;
                do {
                  pppVar22 = pppVar22 + 1;
                  if (cs->id == (uint16_t)(uVar4 << 8 | uVar4 >> 8)) {
                    gettimeofday((timeval *)local_138,(__timezone_ptr_t)0x0);
                    uVar28 = (long)local_138[0].len / 1000 + (long)local_138[0].base * 1000;
                    uVar21 = uVar28 - local_148;
                    ppVar20 = cs;
                    if ((local_148 <= uVar28) && (uVar21 < 0x240c8400)) {
                      local_1d0 = (int)uVar21 + local_19c;
                      if (cs->hash != algo) goto LAB_0010defe;
                      puVar1 = &(tls->field_7).client.field_0x20;
                      *puVar1 = *puVar1 | 1;
                      if (((ulong)local_1a0 != 0) &&
                         ((properties->client).max_early_data_size != (ulong *)0x0)) {
                        *(properties->client).max_early_data_size = (ulong)local_1a0;
                        puVar1 = &(tls->field_7).client.field_0x20;
                        *puVar1 = *puVar1 | 2;
                      }
                      goto LAB_0010df08;
                    }
                    break;
                  }
                  cs = *pppVar22;
                } while (cs != (ptls_cipher_suite_t *)0x0);
                goto LAB_0010dd24;
              }
            }
            goto LAB_0010dd22;
          }
        }
        else {
LAB_0010dd22:
          ppVar20 = (ptls_cipher_suite_t *)0x0;
        }
LAB_0010dd24:
        local_1d0 = 0;
        sVar25 = 0;
        puVar27 = (ushort *)0x0;
        cs = ppVar20;
      }
LAB_0010df08:
      if (((properties->client).max_early_data_size != (size_t *)0x0) &&
         (((tls->field_7).client.field_0x20 & 2) == 0)) {
        *(properties->client).max_early_data_size = 0;
      }
    }
    psVar12 = key_schedule_new(algo);
    tls->key_schedule = psVar12;
    sVar7 = psVar12->algo->digest_size;
    puVar29 = puVar27;
    if (puVar27 == (ushort *)0x0) {
      sVar25 = sVar7;
      puVar29 = (ushort *)zeroes_of_max_digest_size;
    }
    psVar12->generation = psVar12->generation + 1;
    salt.len = sVar7;
    salt.base = psVar12->secret;
    ikm.len = sVar25;
    ikm.base = (uint8_t *)puVar29;
    iVar10 = ptls_hkdf_extract(psVar12->algo,psVar12->secret,salt,ikm);
    if (iVar10 == 0) {
      sVar25 = sendbuf->off;
      iVar10 = ptls_buffer_reserve(sendbuf,3);
      if (iVar10 == 0) {
        puVar26 = sendbuf->base;
        sVar7 = sendbuf->off;
        puVar31 = puVar26 + sVar7;
        puVar31[0] = '\x16';
        puVar31[1] = '\x03';
        puVar26[sVar7 + 2] = '\x01';
        sendbuf->off = sendbuf->off + 3;
        iVar10 = ptls_buffer_reserve(sendbuf,2);
        if (iVar10 == 0) {
          puVar31 = sendbuf->base;
          sVar7 = sendbuf->off;
          (puVar31 + sVar7)[0] = '\0';
          (puVar31 + sVar7)[1] = '\0';
          sVar13 = sendbuf->off;
          sVar7 = sVar13 + 2;
          sendbuf->off = sVar7;
          iVar10 = ptls_buffer_reserve(sendbuf,1);
          if (iVar10 == 0) {
            sendbuf->base[sendbuf->off] = '\x01';
            sendbuf->off = sendbuf->off + 1;
            local_150 = sVar7;
            iVar10 = ptls_buffer_reserve(sendbuf,3);
            if (iVar10 == 0) {
              puVar31 = sendbuf->base;
              sVar7 = sendbuf->off;
              puVar31[sVar7 + 2] = '\0';
              puVar31 = puVar31 + sVar7;
              puVar31[0] = '\0';
              puVar31[1] = '\0';
              sVar14 = sendbuf->off;
              sVar7 = sVar14 + 3;
              sendbuf->off = sVar7;
              iVar10 = ptls_buffer_reserve(sendbuf,2);
              if (iVar10 == 0) {
                puVar31 = sendbuf->base;
                sVar23 = sendbuf->off;
                (puVar31 + sVar23)[0] = '\x03';
                (puVar31 + sVar23)[1] = '\x03';
                sendbuf->off = sendbuf->off + 2;
                local_198 = sVar14;
                local_158 = sVar7;
                iVar10 = ptls_buffer_reserve(sendbuf,0x20);
                if (iVar10 == 0) {
                  (*tls->ctx->random_bytes)(sendbuf->base + sendbuf->off,0x20);
                  sendbuf->off = sendbuf->off + 0x20;
                  iVar10 = ptls_buffer_reserve(sendbuf,1);
                  if (iVar10 == 0) {
                    sendbuf->base[sendbuf->off] = '\0';
                    sVar7 = sendbuf->off;
                    sendbuf->off = sVar7 + 1;
                    sendbuf->base[sVar7] = '\0';
                    iVar10 = ptls_buffer_reserve(sendbuf,2);
                    if (iVar10 == 0) {
                      puVar31 = sendbuf->base;
                      sVar7 = sendbuf->off;
                      (puVar31 + sVar7)[0] = '\0';
                      (puVar31 + sVar7)[1] = '\0';
                      sVar14 = sendbuf->off;
                      sVar7 = sVar14 + 2;
                      sendbuf->off = sVar7;
                      pppVar22 = tls->ctx->cipher_suites;
                      ppVar20 = *pppVar22;
                      local_160 = sVar13;
                      sVar13 = sVar7;
                      while (ppVar20 != (ptls_cipher_suite_t *)0x0) {
                        pppVar22 = pppVar22 + 1;
                        uVar4 = ppVar20->id;
                        iVar10 = ptls_buffer_reserve(sendbuf,2);
                        if (iVar10 != 0) goto LAB_0010ee2c;
                        *(ushort *)(sendbuf->base + sendbuf->off) = uVar4 << 8 | uVar4 >> 8;
                        sVar13 = sendbuf->off + 2;
                        sendbuf->off = sVar13;
                        ppVar20 = *pppVar22;
                      }
                      sendbuf->base[sVar14] = (uint8_t)(sVar13 - sVar7 >> 8);
                      sendbuf->base[sVar14 + 1] = (uint8_t)(sVar13 - sVar7);
                      iVar10 = ptls_buffer_reserve(sendbuf,1);
                      if (iVar10 == 0) {
                        sendbuf->base[sendbuf->off] = '\0';
                        sVar7 = sendbuf->off;
                        sendbuf->off = sVar7 + 1;
                        iVar10 = ptls_buffer_reserve(sendbuf,1);
                        if (iVar10 == 0) {
                          sendbuf->base[sendbuf->off] = '\0';
                          sVar13 = sendbuf->off;
                          sendbuf->off = sVar13 + 1;
                          sendbuf->base[sVar7] = (char)sVar13 - (char)sVar7;
                          iVar10 = ptls_buffer_reserve(sendbuf,2);
                          if (iVar10 == 0) {
                            puVar31 = sendbuf->base;
                            sVar7 = sendbuf->off;
                            (puVar31 + sVar7)[0] = '\0';
                            (puVar31 + sVar7)[1] = '\0';
                            local_168 = sendbuf->off;
                            sVar7 = local_168 + 2;
                            sendbuf->off = sVar7;
                            iVar10 = ptls_buffer_reserve(sendbuf,2);
                            if (iVar10 == 0) {
                              puVar31 = sendbuf->base;
                              sVar13 = sendbuf->off;
                              (puVar31 + sVar13)[0] = '\0';
                              (puVar31 + sVar13)[1] = '+';
                              sendbuf->off = sendbuf->off + 2;
                              iVar10 = ptls_buffer_reserve(sendbuf,2);
                              if (iVar10 == 0) {
                                puVar31 = sendbuf->base;
                                sVar13 = sendbuf->off;
                                (puVar31 + sVar13)[0] = '\0';
                                (puVar31 + sVar13)[1] = '\0';
                                sVar13 = sendbuf->off;
                                sendbuf->off = sVar13 + 2;
                                iVar10 = ptls_buffer_reserve(sendbuf,1);
                                if (iVar10 == 0) {
                                  sendbuf->base[sendbuf->off] = '\0';
                                  sVar14 = sendbuf->off;
                                  sVar23 = sVar14 + 1;
                                  sendbuf->off = sVar23;
                                  iVar10 = ptls_buffer_reserve(sendbuf,2);
                                  if (iVar10 == 0) {
                                    puVar31 = sendbuf->base;
                                    sVar16 = sendbuf->off;
                                    (puVar31 + sVar16)[0] = '\x7f';
                                    (puVar31 + sVar16)[1] = '\x12';
                                    sVar16 = sendbuf->off + 2;
                                    sendbuf->off = sVar16;
                                    sendbuf->base[sVar14] = (char)sVar16 - (char)sVar23;
                                    lVar17 = sendbuf->off - (sVar13 + 2);
                                    sendbuf->base[sVar13] = (uint8_t)((ulong)lVar17 >> 8);
                                    sendbuf->base[sVar13 + 1] = (uint8_t)lVar17;
                                    iVar10 = ptls_buffer_reserve(sendbuf,2);
                                    if (iVar10 == 0) {
                                      puVar31 = sendbuf->base;
                                      sVar13 = sendbuf->off;
                                      (puVar31 + sVar13)[0] = '\0';
                                      (puVar31 + sVar13)[1] = '\r';
                                      sendbuf->off = sendbuf->off + 2;
                                      iVar10 = ptls_buffer_reserve(sendbuf,2);
                                      if (iVar10 == 0) {
                                        puVar31 = sendbuf->base;
                                        sVar13 = sendbuf->off;
                                        (puVar31 + sVar13)[0] = '\0';
                                        (puVar31 + sVar13)[1] = '\0';
                                        sVar13 = sendbuf->off;
                                        sendbuf->off = sVar13 + 2;
                                        iVar10 = ptls_buffer_reserve(sendbuf,2);
                                        if (iVar10 == 0) {
                                          puVar31 = sendbuf->base;
                                          sVar14 = sendbuf->off;
                                          (puVar31 + sVar14)[0] = '\0';
                                          (puVar31 + sVar14)[1] = '\0';
                                          sVar14 = sendbuf->off;
                                          sendbuf->off = sVar14 + 2;
                                          iVar10 = ptls_buffer_reserve(sendbuf,2);
                                          if (iVar10 == 0) {
                                            puVar31 = sendbuf->base;
                                            sVar23 = sendbuf->off;
                                            (puVar31 + sVar23)[0] = '\b';
                                            (puVar31 + sVar23)[1] = '\x04';
                                            sendbuf->off = sendbuf->off + 2;
                                            iVar10 = ptls_buffer_reserve(sendbuf,2);
                                            if (iVar10 == 0) {
                                              puVar31 = sendbuf->base;
                                              sVar23 = sendbuf->off;
                                              (puVar31 + sVar23)[0] = '\x04';
                                              (puVar31 + sVar23)[1] = '\x03';
                                              sendbuf->off = sendbuf->off + 2;
                                              iVar10 = ptls_buffer_reserve(sendbuf,2);
                                              if (iVar10 == 0) {
                                                puVar31 = sendbuf->base;
                                                sVar23 = sendbuf->off;
                                                (puVar31 + sVar23)[0] = '\x04';
                                                (puVar31 + sVar23)[1] = '\x01';
                                                sendbuf->off = sendbuf->off + 2;
                                                iVar10 = ptls_buffer_reserve(sendbuf,2);
                                                if (iVar10 == 0) {
                                                  puVar31 = sendbuf->base;
                                                  sVar23 = sendbuf->off;
                                                  (puVar31 + sVar23)[0] = '\x02';
                                                  (puVar31 + sVar23)[1] = '\x01';
                                                  sVar23 = sendbuf->off;
                                                  sendbuf->off = sVar23 + 2;
                                                  lVar17 = sVar23 - sVar14;
                                                  sendbuf->base[sVar14] =
                                                       (uint8_t)((ulong)lVar17 >> 8);
                                                  sendbuf->base[sVar14 + 1] = (uint8_t)lVar17;
                                                  lVar17 = sendbuf->off - (sVar13 + 2);
                                                  sendbuf->base[sVar13] =
                                                       (uint8_t)((ulong)lVar17 >> 8);
                                                  sendbuf->base[sVar13 + 1] = (uint8_t)lVar17;
                                                  iVar10 = ptls_buffer_reserve(sendbuf,2);
                                                  if (iVar10 == 0) {
                                                    puVar31 = sendbuf->base;
                                                    sVar13 = sendbuf->off;
                                                    (puVar31 + sVar13)[0] = '\0';
                                                    (puVar31 + sVar13)[1] = '\n';
                                                    sendbuf->off = sendbuf->off + 2;
                                                    iVar10 = ptls_buffer_reserve(sendbuf,2);
                                                    if (iVar10 == 0) {
                                                      puVar31 = sendbuf->base;
                                                      sVar13 = sendbuf->off;
                                                      (puVar31 + sVar13)[0] = '\0';
                                                      (puVar31 + sVar13)[1] = '\0';
                                                      sVar13 = sendbuf->off;
                                                      sendbuf->off = sVar13 + 2;
                                                      pppVar30 = tls->ctx->key_exchanges;
                                                      iVar10 = ptls_buffer_reserve(sendbuf,2);
                                                      if (iVar10 == 0) {
                                                        puVar31 = sendbuf->base;
                                                        sVar14 = sendbuf->off;
                                                        (puVar31 + sVar14)[0] = '\0';
                                                        (puVar31 + sVar14)[1] = '\0';
                                                        sVar14 = sendbuf->off;
                                                        sVar23 = sVar14 + 2;
                                                        sendbuf->off = sVar23;
                                                        ppVar8 = *pppVar30;
                                                        local_170 = sVar23;
                                                        while (ppVar8 != (
                                                  ptls_key_exchange_algorithm_t *)0x0) {
                                                    pppVar30 = pppVar30 + 1;
                                                    uVar4 = ppVar8->id;
                                                    iVar10 = ptls_buffer_reserve(sendbuf,2);
                                                    if (iVar10 != 0) goto LAB_0010ee2c;
                                                    *(ushort *)(sendbuf->base + sendbuf->off) =
                                                         uVar4 << 8 | uVar4 >> 8;
                                                    sVar23 = sendbuf->off + 2;
                                                    sendbuf->off = sVar23;
                                                    ppVar8 = *pppVar30;
                                                  }
                                                  sendbuf->base[sVar14] =
                                                       (uint8_t)(sVar23 - local_170 >> 8);
                                                  sendbuf->base[sVar14 + 1] =
                                                       (uint8_t)(sVar23 - local_170);
                                                  lVar17 = sendbuf->off - (sVar13 + 2);
                                                  sendbuf->base[sVar13] =
                                                       (uint8_t)((ulong)lVar17 >> 8);
                                                  sendbuf->base[sVar13 + 1] = (uint8_t)lVar17;
                                                  iVar10 = ptls_buffer_reserve(sendbuf,2);
                                                  if (iVar10 == 0) {
                                                    puVar31 = sendbuf->base;
                                                    sVar13 = sendbuf->off;
                                                    (puVar31 + sVar13)[0] = '\0';
                                                    (puVar31 + sVar13)[1] = '(';
                                                    sendbuf->off = sendbuf->off + 2;
                                                    iVar10 = ptls_buffer_reserve(sendbuf,2);
                                                    if (iVar10 == 0) {
                                                      puVar31 = sendbuf->base;
                                                      sVar13 = sendbuf->off;
                                                      (puVar31 + sVar13)[0] = '\0';
                                                      (puVar31 + sVar13)[1] = '\0';
                                                      sVar13 = sendbuf->off;
                                                      sendbuf->off = sVar13 + 2;
                                                      pppVar30 = tls->ctx->key_exchanges;
                                                      ppVar8 = *pppVar30;
                                                      if (ppVar8 == (ptls_key_exchange_algorithm_t *
                                                                    )0x0) {
                                                        __assert_fail("*algo != NULL",
                                                                                                                                            
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/mattcaswell[P]picotls/t/../lib/picotls.c"
                                                  ,0x398,
                                                  "int send_client_hello(ptls_t *, ptls_buffer_t *, ptls_handshake_properties_t *)"
                                                  );
                                                  }
                                                  iVar10 = (*ppVar8->create)(&(tls->field_7).client.
                                                                              key_exchange.ctx,
                                                                             local_138);
                                                  if (iVar10 == 0) {
                                                    (tls->field_7).client.key_exchange.algo =
                                                         *pppVar30;
                                                    iVar10 = ptls_buffer_reserve(sendbuf,2);
                                                    if (iVar10 == 0) {
                                                      puVar31 = sendbuf->base;
                                                      sVar14 = sendbuf->off;
                                                      (puVar31 + sVar14)[0] = '\0';
                                                      (puVar31 + sVar14)[1] = '\0';
                                                      sVar14 = sendbuf->off;
                                                      sendbuf->off = sVar14 + 2;
                                                      uVar4 = ((tls->field_7).client.key_exchange.
                                                              algo)->id;
                                                      iVar10 = ptls_buffer_reserve(sendbuf,2);
                                                      if (iVar10 == 0) {
                                                        *(ushort *)(sendbuf->base + sendbuf->off) =
                                                             uVar4 << 8 | uVar4 >> 8;
                                                        sendbuf->off = sendbuf->off + 2;
                                                        iVar10 = ptls_buffer_reserve(sendbuf,2);
                                                        if (iVar10 == 0) {
                                                          puVar31 = sendbuf->base;
                                                          sVar23 = sendbuf->off;
                                                          (puVar31 + sVar23)[0] = '\0';
                                                          (puVar31 + sVar23)[1] = '\0';
                                                          sVar23 = sendbuf->off;
                                                          sendbuf->off = sVar23 + 2;
                                                          iVar10 = ptls_buffer__do_pushv
                                                                             (sendbuf,local_138[0].
                                                                                      base,
                                                                              local_138[0].len);
                                                          if (iVar10 == 0) {
                                                            lVar17 = sendbuf->off - (sVar23 + 2);
                                                            sendbuf->base[sVar23] =
                                                                 (uint8_t)((ulong)lVar17 >> 8);
                                                            sendbuf->base[sVar23 + 1] =
                                                                 (uint8_t)lVar17;
                                                            lVar17 = sendbuf->off - (sVar14 + 2);
                                                            sendbuf->base[sVar14] =
                                                                 (uint8_t)((ulong)lVar17 >> 8);
                                                            sendbuf->base[sVar14 + 1] =
                                                                 (uint8_t)lVar17;
                                                            lVar17 = sendbuf->off - (sVar13 + 2);
                                                            sendbuf->base[sVar13] =
                                                                 (uint8_t)((ulong)lVar17 >> 8);
                                                            sendbuf->base[sVar13 + 1] =
                                                                 (uint8_t)lVar17;
                                                            if (puVar27 != (ushort *)0x0) {
                                                              if (((tls->field_7).client.field_0x20
                                                                  & 2) != 0) {
                                                                iVar10 = ptls_buffer_reserve(sendbuf
                                                  ,2);
                                                  if (iVar10 != 0) goto LAB_0010ee2c;
                                                  puVar31 = sendbuf->base;
                                                  sVar13 = sendbuf->off;
                                                  (puVar31 + sVar13)[0] = '\0';
                                                  (puVar31 + sVar13)[1] = '*';
                                                  sendbuf->off = sendbuf->off + 2;
                                                  iVar10 = ptls_buffer_reserve(sendbuf,2);
                                                  if (iVar10 != 0) goto LAB_0010ee2c;
                                                  puVar31 = sendbuf->base;
                                                  sVar13 = sendbuf->off;
                                                  (puVar31 + sVar13)[0] = '\0';
                                                  (puVar31 + sVar13)[1] = '\0';
                                                  sVar13 = sendbuf->off;
                                                  sendbuf->off = sVar13 + 2;
                                                  sendbuf->base[sVar13] = '\0';
                                                  sendbuf->base[sVar13 + 1] = '\0';
                                                  }
                                                  iVar10 = ptls_buffer_reserve(sendbuf,2);
                                                  if (iVar10 != 0) goto LAB_0010ee2c;
                                                  puVar31 = sendbuf->base;
                                                  sVar13 = sendbuf->off;
                                                  (puVar31 + sVar13)[0] = '\0';
                                                  (puVar31 + sVar13)[1] = '-';
                                                  sendbuf->off = sendbuf->off + 2;
                                                  iVar10 = ptls_buffer_reserve(sendbuf,2);
                                                  if (iVar10 != 0) goto LAB_0010ee2c;
                                                  puVar31 = sendbuf->base;
                                                  sVar13 = sendbuf->off;
                                                  (puVar31 + sVar13)[0] = '\0';
                                                  (puVar31 + sVar13)[1] = '\0';
                                                  sVar13 = sendbuf->off;
                                                  sendbuf->off = sVar13 + 2;
                                                  if (tls->ctx->require_dhe_on_psk == 0) {
                                                    iVar10 = ptls_buffer_reserve(sendbuf,1);
                                                    if (iVar10 != 0) goto LAB_0010ee2c;
                                                    sendbuf->base[sendbuf->off] = '\0';
                                                    sendbuf->off = sendbuf->off + 1;
                                                  }
                                                  iVar10 = ptls_buffer_reserve(sendbuf,1);
                                                  if (iVar10 != 0) goto LAB_0010ee2c;
                                                  sendbuf->base[sendbuf->off] = '\x01';
                                                  sVar14 = sendbuf->off + 1;
                                                  sendbuf->off = sVar14;
                                                  lVar17 = sVar14 - (sVar13 + 2);
                                                  sendbuf->base[sVar13] =
                                                       (uint8_t)((ulong)lVar17 >> 8);
                                                  sendbuf->base[sVar13 + 1] = (uint8_t)lVar17;
                                                  iVar10 = ptls_buffer_reserve(sendbuf,2);
                                                  if (iVar10 != 0) goto LAB_0010ee2c;
                                                  puVar31 = sendbuf->base;
                                                  sVar13 = sendbuf->off;
                                                  (puVar31 + sVar13)[0] = '\0';
                                                  (puVar31 + sVar13)[1] = ')';
                                                  sendbuf->off = sendbuf->off + 2;
                                                  iVar10 = ptls_buffer_reserve(sendbuf,2);
                                                  if (iVar10 != 0) goto LAB_0010ee2c;
                                                  puVar31 = sendbuf->base;
                                                  sVar13 = sendbuf->off;
                                                  (puVar31 + sVar13)[0] = '\0';
                                                  (puVar31 + sVar13)[1] = '\0';
                                                  sVar13 = sendbuf->off;
                                                  sendbuf->off = sVar13 + 2;
                                                  iVar10 = ptls_buffer_reserve(sendbuf,2);
                                                  if (iVar10 != 0) goto LAB_0010ee2c;
                                                  puVar31 = sendbuf->base;
                                                  sVar14 = sendbuf->off;
                                                  (puVar31 + sVar14)[0] = '\0';
                                                  (puVar31 + sVar14)[1] = '\0';
                                                  sVar14 = sendbuf->off;
                                                  sendbuf->off = sVar14 + 2;
                                                  iVar10 = ptls_buffer_reserve(sendbuf,2);
                                                  if (iVar10 != 0) goto LAB_0010ee2c;
                                                  puVar31 = sendbuf->base;
                                                  sVar23 = sendbuf->off;
                                                  (puVar31 + sVar23)[0] = '\0';
                                                  (puVar31 + sVar23)[1] = '\0';
                                                  sVar23 = sendbuf->off;
                                                  sendbuf->off = sVar23 + 2;
                                                  iVar10 = ptls_buffer__do_pushv
                                                                     (sendbuf,local_190.base,
                                                                      local_190.capacity);
                                                  if (iVar10 != 0) goto LAB_0010ee2c;
                                                  lVar17 = sendbuf->off - (sVar23 + 2);
                                                  sendbuf->base[sVar23] =
                                                       (uint8_t)((ulong)lVar17 >> 8);
                                                  sendbuf->base[sVar23 + 1] = (uint8_t)lVar17;
                                                  iVar10 = ptls_buffer_reserve(sendbuf,4);
                                                  if (iVar10 != 0) goto LAB_0010ee2c;
                                                  *(uint *)(sendbuf->base + sendbuf->off) =
                                                       local_1d0 >> 0x18 |
                                                       (local_1d0 & 0xff0000) >> 8 |
                                                       (local_1d0 & 0xff00) << 8 | local_1d0 << 0x18
                                                  ;
                                                  sVar23 = sendbuf->off + 4;
                                                  sendbuf->off = sVar23;
                                                  lVar17 = sVar23 - (sVar14 + 2);
                                                  sendbuf->base[sVar14] =
                                                       (uint8_t)((ulong)lVar17 >> 8);
                                                  sendbuf->base[sVar14 + 1] = (uint8_t)lVar17;
                                                  iVar10 = ptls_buffer_reserve(sendbuf,2);
                                                  if (iVar10 != 0) goto LAB_0010ee2c;
                                                  puVar31 = sendbuf->base;
                                                  sVar14 = sendbuf->off;
                                                  (puVar31 + sVar14)[0] = '\0';
                                                  (puVar31 + sVar14)[1] = '\0';
                                                  sVar14 = sendbuf->off;
                                                  sendbuf->off = sVar14 + 2;
                                                  iVar10 = ptls_buffer_reserve(sendbuf,1);
                                                  if (iVar10 != 0) goto LAB_0010ee2c;
                                                  sendbuf->base[sendbuf->off] = '\0';
                                                  sVar23 = sendbuf->off;
                                                  sVar16 = sVar23 + 1;
                                                  sendbuf->off = sVar16;
                                                  iVar10 = ptls_buffer_reserve(sendbuf,tls->
                                                  key_schedule->algo->digest_size);
                                                  if (iVar10 != 0) goto LAB_0010ee2c;
                                                  sVar18 = sendbuf->off +
                                                           tls->key_schedule->algo->digest_size;
                                                  sendbuf->off = sVar18;
                                                  sendbuf->base[sVar23] =
                                                       (char)sVar18 - (char)sVar16;
                                                  lVar17 = sendbuf->off - (sVar14 + 2);
                                                  sendbuf->base[sVar14] =
                                                       (uint8_t)((ulong)lVar17 >> 8);
                                                  sendbuf->base[sVar14 + 1] = (uint8_t)lVar17;
                                                  lVar17 = sendbuf->off - (sVar13 + 2);
                                                  sendbuf->base[sVar13] =
                                                       (uint8_t)((ulong)lVar17 >> 8);
                                                  sendbuf->base[sVar13 + 1] = (uint8_t)lVar17;
                                                  }
                                                  lVar17 = sVar25 + 5;
                                                  lVar19 = sendbuf->off - sVar7;
                                                  sendbuf->base[local_168] =
                                                       (uint8_t)((ulong)lVar19 >> 8);
                                                  sendbuf->base[local_168 + 1] = (uint8_t)lVar19;
                                                  sVar25 = sendbuf->off;
                                                  lVar19 = 0x10;
                                                  do {
                                                    sendbuf->base[local_198] =
                                                         (uint8_t)(sVar25 - local_158 >>
                                                                  ((byte)lVar19 & 0x3f));
                                                    lVar19 = lVar19 + -8;
                                                    local_198 = local_198 + 1;
                                                  } while (lVar19 != -8);
                                                  lVar19 = sendbuf->off - local_150;
                                                  sendbuf->base[local_160] =
                                                       (uint8_t)((ulong)lVar19 >> 8);
                                                  sendbuf->base[local_160 + 1] = (uint8_t)lVar19;
                                                  if (puVar27 != (ushort *)0x0) {
                                                    lVar19 = sendbuf->off -
                                                             tls->key_schedule->algo->digest_size;
                                                    psVar9 = tls->key_schedule->msghash;
                                                    lVar24 = lVar19 + -3;
                                                    (*psVar9->update)(psVar9,sendbuf->base + lVar17,
                                                                      lVar24 - lVar17);
                                                    iVar10 = derive_secret(tls->key_schedule,
                                                                           local_138,
                                                                                                                                                      
                                                  "resumption psk binder key");
                                                  if ((iVar10 != 0) ||
                                                     (iVar10 = calc_verify_data(sendbuf->base +
                                                                                lVar19,tls->
                                                  key_schedule,local_138), lVar17 = lVar24,
                                                  iVar10 != 0)) goto LAB_0010ee2c;
                                                  }
                                                  psVar9 = tls->key_schedule->msghash;
                                                  (*psVar9->update)(psVar9,sendbuf->base + lVar17,
                                                                    sendbuf->off - lVar17);
                                                  if (((tls->field_7).client.field_0x20 & 2) == 0) {
                                                    tls->state = 
                                                  PTLS_STATE_CLIENT_EXPECT_SERVER_HELLO;
                                                  }
                                                  else {
                                                    iVar10 = setup_traffic_protection
                                                                       (tls,cs,1,
                                                  "client early traffic secret");
                                                  if (iVar10 != 0) goto LAB_0010ee2c;
                                                  tls->state = PTLS_STATE_CLIENT_SEND_EARLY_DATA;
                                                  }
                                                  iVar10 = 0x202;
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
LAB_0010ee2c:
    (*ptls_clear_memory)(local_138,0x40);
    return iVar10;
  }
  pvVar2 = (void *)(*inlen + (long)input);
  local_190.base = (uint8_t *)local_138;
  local_190.off = 0;
  local_190.capacity = 0x100;
  local_190.is_allocated = 0;
  if (*inlen == 0) {
    (*ptls_clear_memory)(local_138,0);
    uVar11 = 0x202;
  }
  else {
    do {
      local_1a8 = (ushort *)((long)pvVar2 - (long)input);
      uVar11 = handle_input(tls,sendbuf,&local_190,input,(size_t *)&local_1a8,properties);
      iVar10 = local_190.is_allocated;
      puVar31 = local_190.base;
      if (local_190.off != 0) {
        __assert_fail("decryptbuf.off == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/mattcaswell[P]picotls/t/../lib/picotls.c"
                      ,0x901,
                      "int ptls_handshake(ptls_t *, ptls_buffer_t *, const void *, size_t *, ptls_handshake_properties_t *)"
                     );
      }
      input = (void *)((long)input + (long)local_1a8);
    } while ((uVar11 == 0x202) && (input != pvVar2));
    (*ptls_clear_memory)(local_190.base,0);
    if (iVar10 != 0) {
      free(puVar31);
    }
    if (uVar11 == 0) {
      bVar3 = *(byte *)&(tls->field_7).server;
      uVar11 = 0;
      if ((bVar3 & 1) == 0) goto LAB_0010decc;
      *(byte *)&(tls->field_7).server = bVar3 & 0xfe;
      uVar11 = send_session_ticket(tls,sendbuf);
    }
    if ((uVar11 != 0) && (uVar11 != 0x202)) {
      (*ptls_clear_memory)(sendbuf->base + sVar25,sendbuf->off - sVar25);
      sendbuf->off = sVar25;
      if ((uVar11 & 0xffffff00) != 0x100) {
        uVar15 = 0x50;
        if ((uVar11 & 0xffffff00) == 0) {
          uVar15 = uVar11;
        }
        iVar10 = send_alert(tls,sendbuf,'\x02',(uint8_t)uVar15);
        if (iVar10 != 0) {
          sendbuf->off = sVar25;
        }
      }
    }
  }
LAB_0010decc:
  *inlen = (long)input + (*inlen - (long)pvVar2);
  return uVar11;
}

Assistant:

int ptls_handshake(ptls_t *tls, ptls_buffer_t *sendbuf, const void *input, size_t *inlen, ptls_handshake_properties_t *properties)
{
    size_t sendbuf_orig_off = sendbuf->off;
    int ret;

    assert(tls->state < PTLS_STATE_POST_HANDSHAKE_MIN);

    /* special handlings */
    switch (tls->state) {
    case PTLS_STATE_CLIENT_HANDSHAKE_START:
        assert(input == NULL || *inlen == 0);
        return send_client_hello(tls, sendbuf, properties);
    case PTLS_STATE_CLIENT_SEND_EARLY_DATA:
        if ((ret = send_alert(tls, sendbuf, PTLS_ALERT_LEVEL_WARNING, PTLS_ALERT_END_OF_EARLY_DATA)) != 0)
            return ret;
        tls->state = PTLS_STATE_CLIENT_EXPECT_SERVER_HELLO;
        break;
    default:
        break;
    }

    const uint8_t *src = input, *src_end = src + *inlen;
    ptls_buffer_t decryptbuf;
    uint8_t decryptbuf_small[256];

    ptls_buffer_init(&decryptbuf, decryptbuf_small, sizeof(decryptbuf_small));

    /* perform handhake until completion or until all the input has been swallowed */
    ret = PTLS_ERROR_HANDSHAKE_IN_PROGRESS;
    while (ret == PTLS_ERROR_HANDSHAKE_IN_PROGRESS && src != src_end) {
        size_t consumed = src_end - src;
        ret = handle_input(tls, sendbuf, &decryptbuf, src, &consumed, properties);
        src += consumed;
        assert(decryptbuf.off == 0);
    }

    ptls_buffer_dispose(&decryptbuf);

    if (ret == 0 && tls->server.send_ticket) {
        tls->server.send_ticket = 0;
        ret = send_session_ticket(tls, sendbuf);
    }

    if (!(ret == 0 || ret == PTLS_ERROR_HANDSHAKE_IN_PROGRESS)) {
        /* flush partially written response */
        ptls_clear_memory(sendbuf->base + sendbuf_orig_off, sendbuf->off - sendbuf_orig_off);
        sendbuf->off = sendbuf_orig_off;
        /* send alert immediately */
        if (PTLS_ERROR_GET_CLASS(ret) != PTLS_ERROR_CLASS_PEER_ALERT)
            if (send_alert(tls, sendbuf, PTLS_ALERT_LEVEL_FATAL,
                           PTLS_ERROR_GET_CLASS(ret) == PTLS_ERROR_CLASS_SELF_ALERT ? ret : PTLS_ALERT_INTERNAL_ERROR) != 0)
                sendbuf->off = sendbuf_orig_off;
    }

    *inlen -= src_end - src;
    return ret;
}